

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void add_upvalue_for_ENV(ParserState *parser)

{
  LuaSymbol *pLVar1;
  CompilerState *compiler_state;
  LuaSymbol *symbol;
  ParserState *pPStack_10;
  _Bool is_local;
  ParserState *parser_local;
  
  symbol._7_1_ = 0;
  pPStack_10 = parser;
  pLVar1 = search_for_variable(parser,parser->compiler_state->_ENV,(_Bool *)((long)&symbol + 7));
  if (pLVar1 == (LuaSymbol *)0x0) {
    pLVar1 = (LuaSymbol *)
             (*pPStack_10->compiler_state->allocator->calloc)
                       (pPStack_10->compiler_state->allocator->arena,1,0x48);
    pLVar1->symbol_type = SYM_ENV;
    (pLVar1->field_1).variable.var_name = pPStack_10->compiler_state->_ENV;
    (pLVar1->field_1).variable.block = (Scope *)0x0;
    set_type(&(pLVar1->field_1).variable.value_type,RAVI_TTABLE);
    add_upvalue_in_levels_upto(pPStack_10,pPStack_10->current_function,(AstNode *)0x0,pLVar1);
  }
  else if (((symbol._7_1_ & 1) == 0) && (pLVar1->symbol_type == SYM_LOCAL)) {
    add_upvalue_in_levels_upto
              (pPStack_10,pPStack_10->current_function,((pLVar1->field_1).variable.block)->function,
               pLVar1);
  }
  else if ((pLVar1->symbol_type == SYM_UPVALUE) &&
          ((AstNode *)(pLVar1->field_1).variable.block != pPStack_10->current_function)) {
    add_upvalue_in_levels_upto
              (pPStack_10,pPStack_10->current_function,
               (pLVar1->field_1).upvalue.target_variable_function,
               (pLVar1->field_1).upvalue.target_variable);
  }
  return;
}

Assistant:

static void add_upvalue_for_ENV(ParserState *parser)
{
	bool is_local = false;
	LuaSymbol *symbol = search_for_variable(parser, parser->compiler_state->_ENV, &is_local);
	if (symbol == NULL) {
		// No definition of _ENV found
		// Create special symbol for _ENV - so that upvalues can reference it
		// Note that this symbol is not added to any scope, however upvalue created below will reference it
		CompilerState *compiler_state = parser->compiler_state;
		symbol = (LuaSymbol *) compiler_state->allocator->calloc(compiler_state->allocator->arena, 1, sizeof(LuaSymbol));
		symbol->symbol_type = SYM_ENV;
		symbol->variable.var_name = parser->compiler_state->_ENV;
		symbol->variable.block = NULL;
		set_type(&symbol->variable.value_type, RAVI_TTABLE); // _ENV is by default a table
		// Create an upvalue for _ENV
		add_upvalue_in_levels_upto(parser, parser->current_function, NULL, symbol);
	} else if (!is_local && symbol->symbol_type == SYM_LOCAL) {
		// If _ENV occurred as a local symbol in a parent function then we
		// need to construct an upvalue. Lua requires that the upvalue be
		// added to all functions in the tree up to the function where the local
		// is defined.
		add_upvalue_in_levels_upto(parser, parser->current_function, symbol->variable.block->function, symbol);
	} else if (symbol->symbol_type == SYM_UPVALUE && symbol->upvalue.target_variable_function != parser->current_function) {
		// We found an upvalue but it is not at the same level
		// Ensure all levels have the upvalue
		// Note that if the upvalue refers to special _ENV symbol then target function will be NULL
		add_upvalue_in_levels_upto(parser, parser->current_function, symbol->upvalue.target_variable_function,
					   symbol->upvalue.target_variable);
	}
}